

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_basic_types.cpp
# Opt level: O3

bool __thiscall Potassco::ProgramReader::parse(ProgramReader *this,ReadMode m)

{
  BufferedStream *this_00;
  bool bVar1;
  int iVar2;
  char *exp;
  uint line;
  char *file;
  char *fmt;
  ulong uVar3;
  
  if (this->str_ == (StreamType *)0x0) {
    file = "bool Potassco::ProgramReader::parse(ReadMode)";
    exp = "str_ != 0";
    fmt = "no input stream";
    line = 0x9f;
    uVar3 = 0;
  }
  else {
    while( true ) {
      iVar2 = (*this->_vptr_ProgramReader[3])(this);
      bVar1 = SUB41(iVar2,0);
      if (bVar1 == false) {
        return false;
      }
      BufferedStream::skipWs(this->str_);
      if (this->str_ == (BufferedStream *)0x0) {
        return bVar1;
      }
      BufferedStream::skipWs(this->str_);
      this_00 = this->str_;
      if ((this_00->buf_[this_00->rpos_] != '\0') && (this->inc_ == false)) break;
      if (m != Complete) {
        return bVar1;
      }
      BufferedStream::skipWs(this_00);
      if (this->str_->buf_[this->str_->rpos_] == '\0') {
        return bVar1;
      }
    }
    uVar3 = (ulong)this_00->line_;
    fmt = "parse error in line %u: %s";
    file = (char *)0x0;
    line = 0;
    exp = (char *)0x0;
  }
  fail(-2,file,line,exp,fmt,uVar3);
}

Assistant:

bool ProgramReader::parse(ReadMode m) {
	POTASSCO_REQUIRE(str_ != 0, "no input stream");
	do {
		if (!doParse()) { return false; }
		stream()->skipWs();
		require(!more() || incremental(), "invalid extra input");
	} while (m == Complete && more());
	return true;
}